

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O3

T __thiscall adios2::VariableNT::Max(VariableNT *this,size_t step)

{
  VariableBase *pVVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  long *plVar4;
  long *plVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  size_type *psVar6;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 uVar7;
  undefined4 uVar8;
  T TVar9;
  ulong local_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pVVar1 = this->m_Variable;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"in call to VariableNT::Max","");
  helper::CheckForNullptr<adios2::core::VariableBase>(pVVar1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pVVar1 = this->m_Variable;
  switch(*(undefined4 *)(pVVar1 + 0x28)) {
  case 1:
    uVar2 = adios2::core::Variable<signed_char>::Max((ulong)pVVar1);
    uVar7 = extraout_RDX;
    goto LAB_001d7adc;
  case 2:
    uVar3 = adios2::core::Variable<short>::Max((ulong)pVVar1);
    uVar7 = extraout_RDX_03;
    goto LAB_001d7b2d;
  case 3:
    uVar8 = adios2::core::Variable<int>::Max((ulong)pVVar1);
    uVar7 = extraout_RDX_02;
    goto LAB_001d7b3e;
  case 4:
    TVar9 = (T)adios2::core::Variable<long>::Max((ulong)pVVar1);
    break;
  case 5:
    uVar2 = adios2::core::Variable<unsigned_char>::Max((ulong)pVVar1);
    uVar7 = extraout_RDX_00;
LAB_001d7adc:
    local_118 = CONCAT71(local_118._1_7_,uVar2);
    TVar9._8_8_ = uVar7;
    TVar9.Int64 = local_118;
    break;
  case 6:
    uVar3 = adios2::core::Variable<unsigned_short>::Max((ulong)pVVar1);
    uVar7 = extraout_RDX_04;
LAB_001d7b2d:
    local_118 = CONCAT62(local_118._2_6_,uVar3);
    TVar9._8_8_ = uVar7;
    TVar9.Int64 = local_118;
    break;
  case 7:
    uVar8 = adios2::core::Variable<unsigned_int>::Max((ulong)pVVar1);
    uVar7 = extraout_RDX_05;
LAB_001d7b3e:
    local_118 = CONCAT44(local_118._4_4_,uVar8);
    TVar9._8_8_ = uVar7;
    TVar9.Int64 = local_118;
    break;
  case 8:
    TVar9 = (T)adios2::core::Variable<unsigned_long>::Max((ulong)pVVar1);
    break;
  case 9:
    uVar8 = adios2::core::Variable<float>::Max((ulong)pVVar1);
    local_118 = CONCAT44(local_118._4_4_,uVar8);
    TVar9._8_8_ = extraout_RDX_06;
    TVar9.Int64 = local_118;
    break;
  case 10:
    uVar7 = adios2::core::Variable<double>::Max((ulong)pVVar1);
    TVar9._8_8_ = extraout_RDX_01;
    TVar9.Int64 = uVar7;
    break;
  default:
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"bindings::CXX11","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"VariableNT","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Max","");
    adios2::ToString_abi_cxx11_((DataType)local_70);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1e64d5);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_100 = *plVar5;
      lStack_f8 = plVar4[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar5;
      local_110 = (long *)*plVar4;
    }
    local_108 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0.field_2._8_8_ = plVar4[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar6;
      local_f0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    helper::Throw<std::runtime_error>(&local_90,&local_b0,&local_d0,&local_f0,-1);
    uVar7 = extraout_RDX_07;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
      uVar7 = extraout_RDX_08;
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
      uVar7 = extraout_RDX_09;
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
      uVar7 = extraout_RDX_10;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      uVar7 = extraout_RDX_11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
      uVar7 = extraout_RDX_12;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
      uVar7 = extraout_RDX_13;
    }
    local_118 = local_118 & 0xffffffffffffff00;
    TVar9._8_8_ = uVar7;
    TVar9.UInt64 = local_118;
  }
  return TVar9;
}

Assistant:

VariableNT::T VariableNT::Max(const size_t step) const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::Max");
    if (m_Variable->m_Type == DataType::Int8)
    {
        VariableNT::T ret = {0};
        ret.Int8 = reinterpret_cast<core::Variable<int8_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt8)
    {
        VariableNT::T ret = {0};
        ret.UInt8 = reinterpret_cast<core::Variable<uint8_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Int16)
    {
        VariableNT::T ret = {0};
        ret.Int16 = reinterpret_cast<core::Variable<int16_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt16)
    {
        VariableNT::T ret = {0};
        ret.UInt16 = reinterpret_cast<core::Variable<uint16_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Int32)
    {
        VariableNT::T ret = {0};
        ret.Int32 = reinterpret_cast<core::Variable<int32_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt32)
    {
        VariableNT::T ret = {0};
        ret.UInt32 = reinterpret_cast<core::Variable<uint32_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Int64)
    {
        VariableNT::T ret = {0};
        ret.Int64 = reinterpret_cast<core::Variable<int64_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt64)
    {
        VariableNT::T ret = {0};
        ret.UInt64 = reinterpret_cast<core::Variable<uint64_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Float)
    {
        VariableNT::T ret = {0};
        ret.Float = reinterpret_cast<core::Variable<float> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Double)
    {
        VariableNT::T ret = {0};
        ret.Double = reinterpret_cast<core::Variable<double> *>(m_Variable)->Max(step);
        return ret;
    }
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "Max",
                                      "invalid data type " + ToString(m_Variable->m_Type) +
                                          ", only basic numeric types support this API");
    return {0};
}